

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlaneMap.h
# Opt level: O2

void __thiscall PlaneMap::PlaneMap(PlaneMap *this,Vector *n,Vector *e1)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  
  (this->super_Map)._vptr_Map = (_func_int **)&PTR__Map_0010a940;
  dVar5 = operator&(n,e1);
  dVar1 = n->z;
  dVar2 = n->x;
  dVar3 = n->y;
  dVar6 = operator&(n,n);
  auVar4._8_8_ = dVar5 * dVar3;
  auVar4._0_8_ = dVar5 * dVar2;
  auVar7._8_8_ = dVar6;
  auVar7._0_8_ = dVar6;
  auVar7 = divpd(auVar4,auVar7);
  dVar3 = e1->y;
  dVar2 = e1->z;
  (this->eu).x = e1->x - auVar7._0_8_;
  (this->eu).y = dVar3 - auVar7._8_8_;
  (this->eu).z = dVar2 - (dVar1 * dVar5) / dVar6;
  operator^(n,e1);
  return;
}

Assistant:

PlaneMap(Vector const& n, Vector const& e1)
        : eu( e1 - n * (n & e1) / (n & n) )
        , ev( n ^ e1 )
    {}